

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

bool __thiscall GraphBuilder::matchLocksAndUnlocks(GraphBuilder *this)

{
  long *plVar1;
  bool bVar2;
  PSNode *pPVar3;
  byte bVar4;
  bool bVar5;
  _Hash_node_base *p_Var6;
  const_iterator __begin4;
  const_iterator __begin3;
  Pointer lockPointsTo;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
  mutexPointerIntersection;
  const_iterator local_c0;
  const_iterator local_a8;
  _Hash_node_base *local_90;
  LockNode *local_88;
  PSNode *local_80;
  UnlockNode *local_78;
  PSNode *local_70;
  long lStack_68;
  _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
  local_60 [8];
  undefined4 local_58 [2];
  _Link_type local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  long local_38;
  
  local_90 = (this->llvmToLocks_)._M_h._M_before_begin._M_nxt;
  if (local_90 == (_Hash_node_base *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      local_88 = (LockNode *)local_90[2]._M_nxt;
      local_80 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                           (*(LLVMPointerGraphBuilder **)(this->pointsToAnalysis_ + 0x88),
                            (Value *)local_90[1]._M_nxt);
      for (p_Var6 = (this->llvmToUnlocks_)._M_h._M_before_begin._M_nxt;
          p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
        local_78 = (UnlockNode *)p_Var6[2]._M_nxt;
        pPVar3 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                           (*(LLVMPointerGraphBuilder **)(this->pointsToAnalysis_ + 0x88),
                            (Value *)p_Var6[1]._M_nxt);
        local_58[0] = 0;
        local_50 = (_Link_type)0x0;
        local_48 = local_58;
        local_38 = 0;
        local_a8.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
              (local_80 + 0xc0);
        local_a8.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (__node_type *)0x0;
        local_a8.pos = 0;
        if (*(long *)(local_80 + 200) != 0) {
          if ((*(ulong *)((long)local_a8.container_it.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                ._M_cur + 0x10) & 1) == 0) {
            local_a8.pos = 0;
            do {
              if (local_a8.pos == 0x3f) {
                local_a8.pos = 0x40;
                break;
              }
              bVar4 = (byte)local_a8.pos;
              local_a8.pos = local_a8.pos + 1;
            } while ((*(ulong *)((long)local_a8.container_it.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                       ._M_cur + 0x10) >> (bVar4 & 0x3f) & 2) == 0);
          }
          else {
            local_a8.pos = 0;
          }
        }
        local_40 = local_48;
        if (local_a8.pos != 0 ||
            local_a8.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0) {
          do {
            plVar1 = (long *)(*(long *)((long)local_a8.container_it.
                                              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                              ._M_cur + 8) * 0x10 + -0x10 +
                             local_a8.pos * 0x10 + ___throw_bad_alloc);
            local_70 = (PSNode *)*plVar1;
            lStack_68 = plVar1[1];
            local_c0.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
                 *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                  (pPVar3 + 0xc0);
            local_c0.container_end.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
                 (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                 (__node_type *)0x0;
            local_c0.pos = 0;
            if (*(long *)(pPVar3 + 200) != 0) {
              if ((*(ulong *)((long)local_c0.container_it.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ._M_cur + 0x10) & 1) == 0) {
                local_c0.pos = 0;
                do {
                  if (local_c0.pos == 0x3f) {
                    local_c0.pos = 0x40;
                    break;
                  }
                  bVar4 = (byte)local_c0.pos;
                  local_c0.pos = local_c0.pos + 1;
                } while ((*(ulong *)((long)local_c0.container_it.
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                           ._M_cur + 0x10) >> (bVar4 & 0x3f) & 2) == 0);
              }
              else {
                local_c0.pos = 0;
              }
            }
            while (local_c0.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_c0.pos != 0) {
              if (local_70 ==
                  *(PSNode **)
                   (*(long *)((long)local_c0.container_it.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ._M_cur + 8) * 0x10 + -0x10 +
                   local_c0.pos * 0x10 + ___throw_bad_alloc)) {
                std::
                _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                ::_M_insert_unique<dg::pta::PSNode*const&>(local_60,&local_70);
              }
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++(&local_c0);
            }
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++(&local_a8);
          } while (local_a8.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_a8.pos != 0);
        }
        if (local_38 != 0) {
          bVar2 = LockNode::addCorrespondingUnlock(local_88,local_78);
          bVar5 = (bool)(bVar5 | bVar2);
        }
        std::
        _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
        ::_M_erase((_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                    *)local_60,local_50);
      }
      local_90 = local_90->_M_nxt;
    } while (local_90 != (_Hash_node_base *)0x0);
  }
  return bVar5;
}

Assistant:

bool GraphBuilder::matchLocksAndUnlocks() {
    using namespace dg::pta;
    bool changed = false;
    for (auto lock : llvmToLocks_) {
        auto *lockMutexPtr = pointsToAnalysis_->getPointsToNode(lock.first);
        for (auto unlock : llvmToUnlocks_) {
            auto *unlockMutexPtr =
                    pointsToAnalysis_->getPointsToNode(unlock.first);

            std::set<PSNode *> mutexPointerIntersection;
            for (const auto lockPointsTo : lockMutexPtr->pointsTo) {
                for (const auto unlockPointsTo : unlockMutexPtr->pointsTo) {
                    if (lockPointsTo.target == unlockPointsTo.target) {
                        mutexPointerIntersection.insert(lockPointsTo.target);
                    }
                }
            }

            if (!mutexPointerIntersection.empty()) {
                changed |= lock.second->addCorrespondingUnlock(unlock.second);
            }
        }
    }
    return changed;
}